

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O3

void __thiscall ACustomSprite::BeginPlay(ACustomSprite *this)

{
  ActorRenderFlags *pAVar1;
  undefined8 uVar2;
  uint uVar3;
  FTextureID FVar4;
  char name [9];
  char local_19 [9];
  
  AActor::BeginPlay(&this->super_AActor);
  mysnprintf(local_19,9,"BTIL%04d");
  FVar4 = FTextureManager::GetTexture(&TexMan,local_19,5,0);
  (this->super_AActor).picnum.texnum = FVar4.texnum;
  uVar2 = *(undefined8 *)((this->super_AActor).args + 2);
  (this->super_AActor).Scale.X = (double)(int)uVar2 * 0.015625;
  (this->super_AActor).Scale.Y = (double)(int)((ulong)uVar2 >> 0x20) * 0.015625;
  uVar3 = (this->super_AActor).args[4];
  if ((uVar3 & 2) != 0) {
    (this->super_AActor).RenderStyle = LegacyRenderStyles[6];
    (this->super_AActor).Alpha = *(double *)(&DAT_00765230 + (ulong)((uVar3 >> 9 & 1) == 0) * 8);
  }
  if ((uVar3 & 4) != 0) {
    pAVar1 = &(this->super_AActor).renderflags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 1;
  }
  (this->super_AActor).renderflags.Value =
       (uVar3 & 0x30) << 8 | uVar3 >> 2 & 2 | (this->super_AActor).renderflags.Value;
  return;
}

Assistant:

void ACustomSprite::BeginPlay ()
{
	char name[9];
	Super::BeginPlay ();

	mysnprintf (name, countof(name), "BTIL%04d", args[0] & 0xffff);
	picnum = TexMan.GetTexture (name, FTexture::TEX_Build);

	Scale.X = args[2] / 64.;
	Scale.Y = args[3] / 64.;

	int cstat = args[4];
	if (cstat & 2)
	{
		RenderStyle = STYLE_Translucent;
		Alpha = (cstat & 512) ? 0.6666 : 0.3333;
	}
	if (cstat & 4)
		renderflags |= RF_XFLIP;
	if (cstat & 8)
		renderflags |= RF_YFLIP;

	// set face/wall/floor flags
	renderflags |= ActorRenderFlags::FromInt (((cstat >> 4) & 3) << 12);
}